

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-oid.c
# Opt level: O3

void bson_oid_init_from_string(bson_oid_t *oid,char *str)

{
  int i;
  long lVar1;
  bson_reader_handle_t *reader;
  uint8_t *puVar2;
  int *piVar3;
  ssize_t sVar4;
  bson_reader_destroy_func_t func;
  size_t __nbytes;
  uint uVar5;
  void *__buf;
  int *piVar6;
  byte bVar7;
  byte bVar8;
  
  if (oid == (bson_oid_t *)0x0) {
    bson_oid_init_from_string_cold_2();
  }
  else if (str != (char *)0x0) {
    lVar1 = 0;
    do {
      bVar7 = 0;
      switch(str[lVar1 * 2]) {
      case '1':
        bVar7 = 0x10;
        break;
      case '2':
        bVar7 = 0x20;
        break;
      case '3':
        bVar7 = 0x30;
        break;
      case '4':
        bVar7 = 0x40;
        break;
      case '5':
        bVar7 = 0x50;
        break;
      case '6':
        bVar7 = 0x60;
        break;
      case '7':
        bVar7 = 0x70;
        break;
      case '8':
        bVar7 = 0x80;
        break;
      case '9':
        bVar7 = 0x90;
        break;
      case ':':
      case ';':
      case '<':
      case '=':
      case '>':
      case '?':
      case '@':
        break;
      case 'A':
switchD_0011644f_caseD_41:
        bVar7 = 0xa0;
        break;
      case 'B':
switchD_0011644f_caseD_42:
        bVar7 = 0xb0;
        break;
      case 'C':
switchD_0011644f_caseD_43:
        bVar7 = 0xc0;
        break;
      case 'D':
switchD_0011644f_caseD_44:
        bVar7 = 0xd0;
        break;
      case 'E':
switchD_0011644f_caseD_45:
        bVar7 = 0xe0;
        break;
      case 'F':
switchD_0011644f_caseD_46:
        bVar7 = 0xf0;
        break;
      default:
        bVar7 = 0;
        switch(str[lVar1 * 2]) {
        case 'a':
          goto switchD_0011644f_caseD_41;
        case 'b':
          goto switchD_0011644f_caseD_42;
        case 'c':
          goto switchD_0011644f_caseD_43;
        case 'd':
          goto switchD_0011644f_caseD_44;
        case 'e':
          goto switchD_0011644f_caseD_45;
        case 'f':
          goto switchD_0011644f_caseD_46;
        }
      }
      bVar8 = 0;
      switch(str[lVar1 * 2 + 1]) {
      case '1':
        bVar8 = 1;
        break;
      case '2':
        bVar8 = 2;
        break;
      case '3':
        bVar8 = 3;
        break;
      case '4':
        bVar8 = 4;
        break;
      case '5':
        bVar8 = 5;
        break;
      case '6':
        bVar8 = 6;
        break;
      case '7':
        bVar8 = 7;
        break;
      case '8':
        bVar8 = 8;
        break;
      case '9':
        bVar8 = 9;
        break;
      case ':':
      case ';':
      case '<':
      case '=':
      case '>':
      case '?':
      case '@':
        break;
      case 'A':
switchD_001164c8_caseD_41:
        bVar8 = 10;
        break;
      case 'B':
switchD_001164c8_caseD_42:
        bVar8 = 0xb;
        break;
      case 'C':
switchD_001164c8_caseD_43:
        bVar8 = 0xc;
        break;
      case 'D':
switchD_001164c8_caseD_44:
        bVar8 = 0xd;
        break;
      case 'E':
switchD_001164c8_caseD_45:
        bVar8 = 0xe;
        break;
      case 'F':
switchD_001164c8_caseD_46:
        bVar8 = 0xf;
        break;
      default:
        switch(str[lVar1 * 2 + 1]) {
        case 'a':
          goto switchD_001164c8_caseD_41;
        case 'b':
          goto switchD_001164c8_caseD_42;
        case 'c':
          goto switchD_001164c8_caseD_43;
        case 'd':
          goto switchD_001164c8_caseD_44;
        case 'e':
          goto switchD_001164c8_caseD_45;
        case 'f':
          goto switchD_001164c8_caseD_46;
        }
      }
      oid->bytes[lVar1] = bVar8 | bVar7;
      lVar1 = lVar1 + 1;
      if (lVar1 == 0xc) {
        return;
      }
    } while( true );
  }
  bson_oid_init_from_string_cold_1();
  if (oid != (bson_oid_t *)0x0) {
    return;
  }
  bson_oid_get_time_t_cold_1();
  if (oid != (bson_oid_t *)0x0) {
    *(uint16_t *)str = gHexCharPairs[oid->bytes[0]];
    *(uint16_t *)((bson_reader_read_func_t)str + 2) = gHexCharPairs[oid->bytes[1]];
    *(uint16_t *)((bson_reader_read_func_t)str + 4) = gHexCharPairs[oid->bytes[2]];
    *(uint16_t *)((bson_reader_read_func_t)str + 6) = gHexCharPairs[oid->bytes[3]];
    *(uint16_t *)((bson_reader_read_func_t)str + 8) = gHexCharPairs[oid->bytes[4]];
    *(uint16_t *)((bson_reader_read_func_t)str + 10) = gHexCharPairs[oid->bytes[5]];
    *(uint16_t *)((bson_reader_read_func_t)str + 0xc) = gHexCharPairs[oid->bytes[6]];
    *(uint16_t *)((bson_reader_read_func_t)str + 0xe) = gHexCharPairs[oid->bytes[7]];
    *(uint16_t *)((bson_reader_read_func_t)str + 0x10) = gHexCharPairs[oid->bytes[8]];
    *(uint16_t *)((bson_reader_read_func_t)str + 0x12) = gHexCharPairs[oid->bytes[9]];
    *(uint16_t *)((bson_reader_read_func_t)str + 0x14) = gHexCharPairs[oid->bytes[10]];
    *(uint16_t *)((bson_reader_read_func_t)str + 0x16) = gHexCharPairs[oid->bytes[0xb]];
    ((bson_reader_read_func_t)str)[0x18] = (code)0x0;
    return;
  }
  bson_oid_to_string_cold_1();
  if (oid != (bson_oid_t *)0x0) {
    lVar1 = 0;
    do {
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0xc);
    return;
  }
  bson_oid_hash_cold_1();
  if (oid == (bson_oid_t *)0x0) {
    bson_oid_compare_cold_2();
  }
  else if ((bson_reader_read_func_t)str != (bson_reader_read_func_t)0x0) {
    return;
  }
  bson_oid_compare_cold_1();
  if (oid == (bson_oid_t *)0x0) {
    bson_oid_equal_cold_2();
  }
  else if ((bson_reader_read_func_t)str != (bson_reader_read_func_t)0x0) {
    return;
  }
  bson_oid_equal_cold_1();
  if (oid == (bson_oid_t *)0x0) {
    bson_oid_copy_cold_2();
  }
  else if ((bson_reader_read_func_t)str != (bson_reader_read_func_t)0x0) {
    *(undefined4 *)((bson_reader_read_func_t)str + 8) = *(undefined4 *)(oid->bytes + 8);
    *(undefined8 *)str = *(undefined8 *)oid->bytes;
    return;
  }
  bson_oid_copy_cold_1();
  if (oid != (bson_oid_t *)0x0) {
    if (((bson_reader_read_func_t)str == (bson_reader_read_func_t)0x18) ||
       (((bson_reader_read_func_t)str == (bson_reader_read_func_t)0x19 && (oid[2].bytes[0] == '\0'))
       )) {
      lVar1 = 0;
      while ((uVar5 = oid->bytes[lVar1] - 0x30, uVar5 < 0x37 &&
             ((0x7e0000007e03ffU >> ((ulong)uVar5 & 0x3f) & 1) != 0))) {
        lVar1 = lVar1 + 1;
        if (lVar1 == 0x18) {
          return;
        }
      }
    }
    return;
  }
  bson_oid_is_valid_cold_1();
  if (oid == (bson_oid_t *)0x0) {
    bson_reader_new_from_handle_cold_2();
  }
  else if ((bson_reader_read_func_t)str != (bson_reader_read_func_t)0x0) {
    reader = (bson_reader_handle_t *)bson_malloc0(0x180);
    reader->type = BSON_READER_HANDLE;
    puVar2 = (uint8_t *)bson_malloc0(0x400);
    reader->data = puVar2;
    reader->handle = oid;
    reader->len = 0x400;
    reader->offset = 0;
    bson_reader_set_read_func((bson_reader_t *)reader,(bson_reader_read_func_t)str);
    if (func != (bson_reader_destroy_func_t)0x0) {
      bson_reader_set_destroy_func((bson_reader_t *)reader,func);
    }
    _bson_reader_handle_fill_buffer(reader);
    return;
  }
  bson_reader_new_from_handle_cold_1();
  if (*(int *)oid->bytes == 1) {
    *(char **)oid[0x16].bytes = str;
    return;
  }
  bson_reader_set_read_func_cold_1();
  if (*(int *)oid->bytes == 1) {
    *(char **)(oid[0x16].bytes + 8) = str;
    return;
  }
  bson_reader_set_destroy_func_cold_1();
  lVar1 = *(long *)(oid[3].bytes + 4);
  if (lVar1 == 0 && (oid[1].bytes[4] & 1) == 0) {
    if (*(long *)oid[2].bytes == 0) {
      lVar1 = (**(code **)oid[0x16].bytes)
                        (*(undefined8 *)(oid->bytes + 8),*(undefined8 *)(oid[0x15].bytes + 4),
                         *(undefined8 *)(oid[2].bytes + 8));
      if (0 < lVar1) {
        *(long *)oid[4].bytes = *(long *)oid[4].bytes + lVar1;
        *(long *)oid[2].bytes = lVar1;
        return;
      }
      oid[1].bytes[4] = oid[1].bytes[4] | 1;
      return;
    }
    lVar1 = 0;
  }
  memmove(*(void **)(oid[0x15].bytes + 4),(void *)((long)*(void **)(oid[0x15].bytes + 4) + lVar1),
          *(long *)oid[2].bytes - lVar1);
  piVar6 = *(int **)(oid->bytes + 8);
  lVar1 = *(long *)oid[2].bytes - *(long *)(oid[3].bytes + 4);
  *(long *)oid[2].bytes = lVar1;
  oid[3].bytes[4] = '\0';
  oid[3].bytes[5] = '\0';
  oid[3].bytes[6] = '\0';
  oid[3].bytes[7] = '\0';
  oid[3].bytes[8] = '\0';
  oid[3].bytes[9] = '\0';
  oid[3].bytes[10] = '\0';
  oid[3].bytes[0xb] = '\0';
  __buf = (void *)(*(long *)(oid[0x15].bytes + 4) + lVar1);
  lVar1 = (**(code **)oid[0x16].bytes)(piVar6,__buf,*(long *)(oid[2].bytes + 8) - lVar1);
  if (lVar1 < 1) {
    oid[1].bytes[4] = ((lVar1 != 0) * '\x02' | oid[1].bytes[4] & 0xfc) + 1;
  }
  else {
    *(long *)oid[4].bytes = *(long *)oid[4].bytes + lVar1;
    *(long *)oid[2].bytes = *(long *)oid[2].bytes + lVar1;
  }
  if (*(long *)(oid[3].bytes + 4) == 0) {
    if (*(ulong *)oid[2].bytes <= *(ulong *)(oid[2].bytes + 8)) {
      return;
    }
  }
  else {
    _bson_reader_handle_fill_buffer_cold_1();
  }
  _bson_reader_handle_fill_buffer_cold_2();
  if ((int)piVar6 == -1) {
    bson_reader_new_from_fd_cold_1();
    if ((piVar6 != (int *)0x0) && (*piVar6 != -1)) {
      do {
        sVar4 = read(*piVar6,__buf,__nbytes);
        if (sVar4 != -1) {
          return;
        }
        piVar3 = __errno_location();
      } while (*piVar3 == 0xb);
    }
    return;
  }
  piVar3 = (int *)bson_malloc0(8);
  *piVar3 = (int)piVar6;
  *(char *)(piVar3 + 1) = (char)__buf;
  bson_reader_new_from_handle(piVar3,_bson_reader_handle_fd_read,_bson_reader_handle_fd_destroy);
  return;
}

Assistant:

void
bson_oid_init_from_string (bson_oid_t *oid, /* OUT */
                           const char *str) /* IN */
{
   BSON_ASSERT (oid);
   BSON_ASSERT (str);

   bson_oid_init_from_string_unsafe (oid, str);
}